

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

int __thiscall
gmath::RationalTangentialDistortion::clone
          (RationalTangentialDistortion *this,__fn *__fn,void *__child_stack,int __flags,void *__arg
          ,...)

{
  void *pvVar1;
  int i;
  RationalTangentialDistortion *ret;
  int local_20;
  
  pvVar1 = operator_new(0x48);
  RationalTangentialDistortion(this);
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    *(double *)((long)pvVar1 + (long)local_20 * 8 + 8) = this->kd[local_20];
  }
  return (int)pvVar1;
}

Assistant:

Distortion *RationalTangentialDistortion::clone() const
{
  RationalTangentialDistortion *ret=new RationalTangentialDistortion();

  for (int i=0; i<8; i++)
  {
    ret->kd[i]=kd[i];
  }

  return ret;
}